

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkSetSmallNumEFails(void *arkode_mem,int small_nef)

{
  int iVar1;
  int iVar2;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetSmallNumEFails",&ark_mem,&hadapt_mem);
  if (iVar1 == 0) {
    iVar2 = 2;
    if (0 < small_nef) {
      iVar2 = small_nef;
    }
    hadapt_mem->small_nef = iVar2;
  }
  return iVar1;
}

Assistant:

int arkSetSmallNumEFails(void *arkode_mem, int small_nef)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetSmallNumEFails",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if argument legal set it, otherwise set default */
  if (small_nef <= 0) {
    hadapt_mem->small_nef = SMALL_NEF;
  } else {
    hadapt_mem->small_nef = small_nef;
  }

  return(ARK_SUCCESS);
}